

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::computeFactor(HModel *this)

{
  double dVar1;
  double dVar2;
  __time_t _Var3;
  __suseconds_t _Var4;
  uint uVar5;
  timeval tv;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  _Var4 = local_28.tv_usec;
  _Var3 = local_28.tv_sec;
  dVar1 = (this->timer).startTime;
  HFactor::build(&this->factor);
  this->countUpdate = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  dVar2 = (this->timer).startTime;
  uVar5 = this->totalInverts + 1;
  this->totalInverts = uVar5;
  this->totalInvertTime =
       this->totalInvertTime +
       (((double)local_28.tv_usec / 1000000.0 + (double)local_28.tv_sec) - dVar2) +
       (dVar1 - ((double)_Var3 + (double)_Var4 / 1000000.0));
  printf("           INVERT  %4d     on iteration %9d: INVERT  time = %11.4g; Total INVERT  time = %11.4g\n"
         ,(ulong)uVar5,(ulong)(uint)this->numberIteration);
  this->mlFg_haveInvert = 1;
  this->mlFg_haveFreshInvert = 1;
  return;
}

Assistant:

void HModel::computeFactor() {
#ifdef JAJH_dev
  //	double tt0 = timer.getTime();
#endif
	double tt0 = timer.getTime();
    try {
        factor.build();
    } catch (runtime_error& error) {
        cout << error.what() << endl;
        problemStatus = LP_Status_Singular;
        // TODO Change to return
#ifdef JAJH_dev
        writePivots("failed");
#endif
        exit(0);
    }
    //    printf("INVERT: After %d iterations and %d updates\n", numberIteration, countUpdate);
    countUpdate = 0;

    double invertTime = timer.getTime()-tt0;
    totalInverts++;
    totalInvertTime += invertTime;
#ifdef JAJH_dev
    printf("           INVERT  %4d     on iteration %9d: INVERT  time = %11.4g; Total INVERT  time = %11.4g\n",
	   totalInverts, numberIteration, invertTime, totalInvertTime);
#endif

    //Now have a representation of B^{-1}, and it is fresh!
    mlFg_haveInvert = 1;
    mlFg_haveFreshInvert = 1;
}